

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportInstallFileGenerator::GenerateImportTargetsConfig
          (cmExportInstallFileGenerator *this,ostream *os,string *config,string *suffix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  size_t *this_00;
  cmTargetExport *pcVar1;
  cmGeneratorTarget *target;
  bool bVar2;
  TargetType TVar3;
  cmExportSet *pcVar4;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *pvVar5;
  reference ppcVar6;
  cmGeneratorTarget *gtgt;
  undefined1 local_a8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  importedLocations;
  ImportPropertyMap properties;
  cmTargetExport *te;
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_38;
  const_iterator tei;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  string *suffix_local;
  string *config_local;
  ostream *os_local;
  cmExportInstallFileGenerator *this_local;
  
  tei._M_current = (cmTargetExport **)missingTargets;
  pcVar4 = cmInstallExportGenerator::GetExportSet(this->IEGen);
  pvVar5 = cmExportSet::GetTargetExports(pcVar4);
  local_38._M_current =
       (cmTargetExport **)
       std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(pvVar5);
  while( true ) {
    pcVar4 = cmInstallExportGenerator::GetExportSet(this->IEGen);
    pvVar5 = cmExportSet::GetTargetExports(pcVar4);
    te = (cmTargetExport *)
         std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(pvVar5);
    bVar2 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                        *)&te);
    if (!bVar2) break;
    ppcVar6 = __gnu_cxx::
              __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
              ::operator*(&local_38);
    pcVar1 = *ppcVar6;
    TVar3 = cmGeneratorTarget::GetType(pcVar1->Target);
    if (TVar3 != INTERFACE_LIBRARY) {
      this_00 = &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)this_00);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a8);
      SetImportLocationProperty
                (this,config,suffix,pcVar1->ArchiveGenerator,(ImportPropertyMap *)this_00,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      SetImportLocationProperty
                (this,config,suffix,pcVar1->LibraryGenerator,
                 (ImportPropertyMap *)
                 &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      SetImportLocationProperty
                (this,config,suffix,pcVar1->RuntimeGenerator,
                 (ImportPropertyMap *)
                 &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      SetImportLocationProperty
                (this,config,suffix,pcVar1->ObjectsGenerator,
                 (ImportPropertyMap *)
                 &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      SetImportLocationProperty
                (this,config,suffix,pcVar1->FrameworkGenerator,
                 (ImportPropertyMap *)
                 &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      SetImportLocationProperty
                (this,config,suffix,pcVar1->BundleGenerator,
                 (ImportPropertyMap *)
                 &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      bVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (!bVar2) {
        target = pcVar1->Target;
        cmExportFileGenerator::SetImportDetailProperties
                  (&this->super_cmExportFileGenerator,config,suffix,target,
                   (ImportPropertyMap *)
                   &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)tei._M_current);
        cmExportFileGenerator::SetImportLinkInterface
                  (&this->super_cmExportFileGenerator,config,suffix,InstallInterface,target,
                   (ImportPropertyMap *)
                   &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)tei._M_current);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                  (this,os,config,target,
                   &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[8])
                  (this,os,target,
                   &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,local_a8);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    __gnu_cxx::
    __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix,
  std::vector<std::string>& missingTargets)
{
  // Add each target in the set to the export.
  for (std::vector<cmTargetExport*>::const_iterator tei =
         this->IEGen->GetExportSet()->GetTargetExports()->begin();
       tei != this->IEGen->GetExportSet()->GetTargetExports()->end(); ++tei) {
    // Collect import properties for this target.
    cmTargetExport const* te = *tei;
    if (te->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    ImportPropertyMap properties;
    std::set<std::string> importedLocations;

    this->SetImportLocationProperty(config, suffix, te->ArchiveGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->LibraryGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->RuntimeGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->ObjectsGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->FrameworkGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->BundleGenerator,
                                    properties, importedLocations);

    // If any file location was set for the target add it to the
    // import file.
    if (!properties.empty()) {
      // Get the rest of the target details.
      cmGeneratorTarget* gtgt = te->Target;
      this->SetImportDetailProperties(config, suffix, gtgt, properties,
                                      missingTargets);

      this->SetImportLinkInterface(config, suffix,
                                   cmGeneratorExpression::InstallInterface,
                                   gtgt, properties, missingTargets);

      // TOOD: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      this->GenerateImportPropertyCode(os, config, gtgt, properties);
      this->GenerateImportedFileChecksCode(os, gtgt, properties,
                                           importedLocations);
    }
  }
}